

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Log.cpp
# Opt level: O2

void Log::record_log(void)

{
  pointer pbVar1;
  time_t __val;
  ostream *poVar2;
  pointer pbVar3;
  string element;
  string local_248;
  ofstream log;
  
  std::ofstream::ofstream(&log);
  std::ofstream::open((char *)&log,0x1073e0);
  __val = time((time_t *)0x0);
  std::__cxx11::to_string(&local_248,__val);
  std::operator+(&element,"Log Data for ",&local_248);
  poVar2 = std::operator<<((ostream *)&log,(string *)&element);
  std::operator<<(poVar2,"\n\n");
  std::__cxx11::string::~string((string *)&element);
  std::__cxx11::string::~string((string *)&local_248);
  pbVar1 = records_abi_cxx11_.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar3 = records_abi_cxx11_.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pbVar3 != pbVar1; pbVar3 = pbVar3 + 1) {
    std::__cxx11::string::string((string *)&element,(string *)pbVar3);
    std::operator<<((ostream *)&log,(string *)&element);
    std::operator<<((ostream *)&log,"\n-----------------------------------------------\n");
    std::__cxx11::string::~string((string *)&element);
  }
  std::ofstream::close();
  std::ofstream::~ofstream(&log);
  return;
}

Assistant:

void Log::record_log() {
    std::ofstream log = std::ofstream();
    log.open("LogFile.txt");
    log << "Log Data for " + std::to_string(time(0)) << "\n\n";
    for (std::string element : Log::records) {
        log << element;
        log << "\n-----------------------------------------------\n";
    }
    log.close();
}